

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O2

void on_amqp_frame_received
               (void *context,uint16_t channel,AMQP_VALUE performative,uchar *payload_bytes,
               uint32_t payload_size)

{
  long lVar1;
  uint16_t *puVar2;
  CONNECTION_STATE connection_state;
  _Bool _Var3;
  char cVar4;
  int iVar5;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  AMQP_VALUE descriptor;
  AMQP_VALUE descriptor_00;
  ulong uVar6;
  ENDPOINT_HANDLE endpoint;
  char *pcVar7;
  LOGGER_LOG l;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar8;
  OPEN_HANDLE open_handle;
  uint16_t remote_channel;
  ERROR_HANDLE error;
  AMQP_VALUE local_40;
  char *local_38;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  iVar5 = tickcounter_get_current_ms
                    (*(TICK_COUNTER_HANDLE *)((long)context + 0x48),
                     (tickcounter_ms_t *)((long)context + 200));
  if (iVar5 != 0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"on_amqp_frame_received",0x336,1,"Cannot get tickcounter value");
    }
    close_connection_with_error
              ((CONNECTION_HANDLE)context,"amqp:internal-error","cannot get current tick count",
               (AMQP_VALUE)0x0);
    return;
  }
  if ((*(byte *)((long)context + 0xe0) & 1) == 0) {
    return;
  }
  if ((*(uint *)((long)context + 0x10) < 0xe) &&
     ((0x2435U >> (*(uint *)((long)context + 0x10) & 0x1f) & 1) != 0)) {
    iVar5 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    if (iVar5 == 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar7 = "xio_close failed";
    iVar5 = 0x44e;
  }
  else {
    if (performative != (AMQP_VALUE)0x0) {
      descriptor = amqpvalue_get_inplace_descriptor(performative);
      if ((*(byte *)((long)context + 0xe0) & 8) != 0) {
        local_40 = descriptor;
        descriptor_00 = amqpvalue_get_inplace_descriptor(performative);
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        descriptor = local_40;
        if (descriptor_00 == (AMQP_VALUE)0x0) {
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"log_incoming_frame",0xdc,1,"Error getting performative descriptor");
          }
        }
        else {
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_TRACE,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"log_incoming_frame",0xe1,0,"<- ");
          }
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar7 = get_frame_type_as_string(descriptor_00);
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_TRACE,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"log_incoming_frame",0xe2,0,"%s",pcVar7);
            uVar8 = (undefined4)((ulong)pcVar7 >> 0x20);
          }
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7 = amqpvalue_to_string(performative);
            local_38 = pcVar7;
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_TRACE,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"log_incoming_frame",0xe4,1,"%s",pcVar7);
            uVar8 = (undefined4)((ulong)pcVar7 >> 0x20);
            pcVar7 = local_38;
          }
          descriptor = local_40;
          free(pcVar7);
        }
      }
      _Var3 = is_open_type_by_descriptor(descriptor);
      if (_Var3) {
        if (channel != 0) {
          close_connection_with_error
                    ((CONNECTION_HANDLE)context,"amqp:not-allowed",
                     "OPEN frame received on a channel that is not 0",(AMQP_VALUE)0x0);
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                       ,"on_amqp_frame_received",0x356,1,
                       "OPEN frame received on a channel that is not 0");
          }
        }
        iVar5 = *(int *)((long)context + 0x10);
        if ((iVar5 != 3) && (iVar5 != 7)) {
          if (iVar5 != 9) {
            return;
          }
          close_connection_with_error
                    ((CONNECTION_HANDLE)context,"amqp:illegal-state",
                     "OPEN frame received in the OPENED state",(AMQP_VALUE)0x0);
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            return;
          }
          pcVar7 = "OPEN frame received in the OPENED state";
          iVar5 = 0x35d;
          goto LAB_0010ddf1;
        }
        iVar5 = amqpvalue_get_open(performative,&open_handle);
        if (iVar5 == 0) {
          iVar5 = open_get_idle_time_out
                            ((OPEN_HANDLE)CONCAT44(open_handle._4_4_,open_handle._0_4_),
                             (milliseconds *)((long)context + 0xb4));
          if (iVar5 == 0) {
            *(int *)((long)context + 0xb8) =
                 (int)(long)((double)*(uint *)((long)context + 0xb4) *
                            *(double *)((long)context + 0xc0));
          }
          iVar5 = open_get_max_frame_size
                            ((OPEN_HANDLE)CONCAT44(open_handle._4_4_,open_handle._0_4_),
                             (uint32_t *)((long)context + 0x50));
          if ((iVar5 == 0) && (0x1ff < *(uint32_t *)((long)context + 0x50))) {
            if ((*(int *)((long)context + 0x10) == 7) ||
               (iVar5 = send_open_frame((CONNECTION_HANDLE)context), iVar5 == 0)) {
              connection_state = CONNECTION_STATE_OPENED;
            }
            else {
              connection_state = CONNECTION_STATE_END;
            }
            connection_set_state((CONNECTION_HANDLE)context,connection_state);
          }
          else {
            close_connection_with_error
                      ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                       "connection_endpoint_frame_received::failed parsing OPEN frame",
                       (AMQP_VALUE)0x0);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                         ,"on_amqp_frame_received",0x379,1,
                         "connection_endpoint_frame_received::failed parsing OPEN frame");
            }
          }
          open_destroy((OPEN_HANDLE)CONCAT44(open_handle._4_4_,open_handle._0_4_));
          return;
        }
        close_connection_with_error
                  ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                   "connection_endpoint_frame_received::failed parsing OPEN frame",(AMQP_VALUE)0x0);
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
          return;
        }
        pcVar7 = "connection_endpoint_frame_received::failed parsing OPEN frame";
        iVar5 = 0x368;
      }
      else {
        _Var3 = is_close_type_by_descriptor(descriptor);
        if (_Var3) {
          if ((*(uint *)((long)context + 0x10) < 0xd) &&
             ((0x184aU >> (*(uint *)((long)context + 0x10) & 0x1f) & 1) != 0)) {
            iVar5 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
            if (iVar5 == 0) {
              return;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
              return;
            }
            pcVar7 = "xio_close failed";
            iVar5 = 0x3a7;
            goto LAB_0010ddf1;
          }
          if (*(ushort *)((long)context + 0xac) < channel) {
            close_connection_with_error
                      ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                       "connection_endpoint_frame_received::failed parsing CLOSE frame",
                       (AMQP_VALUE)0x0);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
              return;
            }
            pcVar7 = "connection_endpoint_frame_received::failed parsing CLOSE frame";
            iVar5 = 0x3b2;
          }
          else {
            iVar5 = amqpvalue_get_close(performative,(CLOSE_HANDLE *)&open_handle);
            if (iVar5 == 0) {
              iVar5 = close_get_error((CLOSE_HANDLE)CONCAT44(open_handle._4_4_,open_handle._0_4_),
                                      &error);
              if (iVar5 != 0) {
                error = (ERROR_HANDLE)0x0;
              }
              close_destroy((CLOSE_HANDLE)CONCAT44(open_handle._4_4_,open_handle._0_4_));
              connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_CLOSE_RCVD);
              iVar5 = send_close_frame((CONNECTION_HANDLE)context,(ERROR_HANDLE)0x0);
              if ((iVar5 != 0) &&
                 (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                 UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                           ,"on_amqp_frame_received",0x3ca,1,"Cannot send CLOSE frame");
              }
              iVar5 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
              if ((iVar5 != 0) &&
                 (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
                 UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                           ,"on_amqp_frame_received",0x3d0,1,"xio_close failed");
              }
              connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_END);
              if (*(code **)((long)context + 0x98) != (code *)0x0) {
                (**(code **)((long)context + 0x98))(*(undefined8 *)((long)context + 0xa0),error);
              }
              error_destroy(error);
              return;
            }
            close_connection_with_error
                      ((CONNECTION_HANDLE)context,"amqp:invalid-field",
                       "connection_endpoint_frame_received::failed parsing CLOSE frame",
                       (AMQP_VALUE)0x0);
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
              return;
            }
            pcVar7 = "connection_endpoint_frame_received::failed parsing CLOSE frame";
            iVar5 = 0x3b9;
          }
        }
        else {
          iVar5 = amqpvalue_get_ulong(descriptor,(uint64_t *)&open_handle);
          if (iVar5 == 0) {
            if (CONCAT44(open_handle._4_4_,open_handle._0_4_) - 0x12U < 6) {
              for (uVar6 = 0; *(uint *)((long)context + 0x30) != uVar6; uVar6 = uVar6 + 1) {
                if (**(uint16_t **)(*(long *)((long)context + 0x28) + uVar6 * 8) == channel) {
                  if (*(uint *)((long)context + 0x30) != (uint)uVar6) {
                    lVar1 = *(long *)(*(long *)((long)context + 0x28) + uVar6 * 8);
                    if (lVar1 != 0) {
                      (**(code **)(lVar1 + 8))
                                (*(undefined8 *)(lVar1 + 0x18),performative,payload_size,
                                 payload_bytes);
                      return;
                    }
                    goto LAB_0010e2ec;
                  }
                  break;
                }
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                           ,"find_session_endpoint_by_incoming_channel",0x26b,1,
                           "Cannot find session endpoint for channel %u",
                           CONCAT44(uVar8,(uint)channel));
              }
LAB_0010e2ec:
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
                return;
              }
              pcVar7 = "Cannot find session endpoint for channel %u";
              iVar5 = 0x431;
            }
            else if (CONCAT44(open_handle._4_4_,open_handle._0_4_) == 0x11) {
              iVar5 = amqpvalue_get_begin(performative,(BEGIN_HANDLE *)&error);
              if (iVar5 == 0) {
                iVar5 = begin_get_remote_channel((BEGIN_HANDLE)error,&remote_channel);
                if (iVar5 == 0) {
                  for (uVar6 = 0; *(uint *)((long)context + 0x30) != uVar6; uVar6 = uVar6 + 1) {
                    if (*(uint16_t *)(*(long *)(*(long *)((long)context + 0x28) + uVar6 * 8) + 2) ==
                        remote_channel) {
                      if (*(uint *)((long)context + 0x30) != (uint)uVar6) {
                        puVar2 = *(uint16_t **)(*(long *)((long)context + 0x28) + uVar6 * 8);
                        if (puVar2 == (uint16_t *)0x0) goto LAB_0010e616;
                        *puVar2 = channel;
                        (**(code **)(puVar2 + 4))
                                  (*(undefined8 *)(puVar2 + 0xc),performative,payload_size,
                                   payload_bytes);
                        goto LAB_0010e666;
                      }
                      break;
                    }
                  }
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                               ,"find_session_endpoint_by_outgoing_channel",0x251,1,
                               "Cannot find session endpoint for channel %u",
                               CONCAT44(uVar8,(uint)remote_channel));
                  }
LAB_0010e616:
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                               ,"on_amqp_frame_received",0x410,1,"Cannot create session endpoint");
                  }
                }
                else if (*(long *)((long)context + 0x68) != 0) {
                  endpoint = connection_create_endpoint((CONNECTION_HANDLE)context);
                  cVar4 = (**(code **)((long)context + 0x68))
                                    (*(undefined8 *)((long)context + 0x70),endpoint);
                  if (cVar4 == '\0') {
                    connection_destroy_endpoint(endpoint);
                  }
                  else if (endpoint != (ENDPOINT_HANDLE)0x0) {
                    endpoint->incoming_channel = channel;
                    (*endpoint->on_endpoint_frame_received)
                              (endpoint->callback_context,performative,payload_size,payload_bytes);
                  }
                }
LAB_0010e666:
                begin_destroy((BEGIN_HANDLE)error);
                return;
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
                return;
              }
              pcVar7 = "Cannot get begin performative";
              iVar5 = 0x3f5;
            }
            else {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
                return;
              }
              pcVar7 = "Bad performative: %02x";
              iVar5 = 0x3ec;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
              return;
            }
            pcVar7 = "Failed getting ulong amqp performative";
            iVar5 = 0x3e5;
          }
        }
      }
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                 ,"on_amqp_frame_received",iVar5,1,pcVar7);
      return;
    }
    close_connection_with_error
              ((CONNECTION_HANDLE)context,"amqp:internal-error",
               "connection_endpoint_frame_received::NULL performative",(AMQP_VALUE)0x0);
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar7 = "connection_endpoint_frame_received::NULL performative";
    iVar5 = 0x344;
  }
LAB_0010ddf1:
  (*UNRECOVERED_JUMPTABLE)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
             ,"on_amqp_frame_received",iVar5,1,pcVar7);
  return;
}

Assistant:

static void on_amqp_frame_received(void* context, uint16_t channel, AMQP_VALUE performative, const unsigned char* payload_bytes, uint32_t payload_size)
{
    CONNECTION_HANDLE connection = (CONNECTION_HANDLE)context;

    (void)channel;

    if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_received_time) != 0)
    {
        LogError("Cannot get tickcounter value");
        close_connection_with_error(connection, "amqp:internal-error", "cannot get current tick count", NULL);
    }
    else
    {
        if (connection->is_underlying_io_open)
        {
            switch (connection->connection_state)
            {
            default:
                if (performative == NULL)
                {
                    /* Codes_S_R_S_CONNECTION_01_223: [If the on_endpoint_frame_received is called with a NULL performative then the connection shall be closed with the error condition amqp:internal-error and an implementation defined error description.] */
                    close_connection_with_error(connection, "amqp:internal-error", "connection_endpoint_frame_received::NULL performative", NULL);
                    LogError("connection_endpoint_frame_received::NULL performative");
                }
                else
                {
                    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

                    if (connection->is_trace_on == 1)
                    {
                        log_incoming_frame(performative);
                    }

                    if (is_open_type_by_descriptor(descriptor))
                    {
                        if (channel != 0)
                        {
                            /* Codes_S_R_S_CONNECTION_01_006: [The open frame can only be sent on channel 0.] */
                            /* Codes_S_R_S_CONNECTION_01_222: [If an Open frame is received in a manner violating the ISO specification, the connection shall be closed with condition amqp:not-allowed and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:not-allowed", "OPEN frame received on a channel that is not 0", NULL);
                            LogError("OPEN frame received on a channel that is not 0");
                        }

                        if (connection->connection_state == CONNECTION_STATE_OPENED)
                        {
                            /* Codes_S_R_S_CONNECTION_01_239: [If an Open frame is received in the Opened state the connection shall be closed with condition amqp:illegal-state and description being an implementation defined string.] */
                            close_connection_with_error(connection, "amqp:illegal-state", "OPEN frame received in the OPENED state", NULL);
                            LogError("OPEN frame received in the OPENED state");
                        }
                        else if ((connection->connection_state == CONNECTION_STATE_OPEN_SENT) ||
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH))
                        {
                            OPEN_HANDLE open_handle;
                            if (amqpvalue_get_open(performative, &open_handle) != 0)
                            {
                                /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                            }
                            else
                            {
                                if (open_get_idle_time_out(open_handle, &connection->remote_idle_timeout) == 0)
                                {
                                    /* since we obtained the remote_idle_timeout, compute at what millisecond we should send the empty frame */
                                    connection->remote_idle_timeout_send_frame_millisecond = (milliseconds)(connection->idle_timeout_empty_frame_send_ratio * connection->remote_idle_timeout);
                                }

                                if ((open_get_max_frame_size(open_handle, &connection->remote_max_frame_size) != 0) ||
                                    /* Codes_S_R_S_CONNECTION_01_167: [Both peers MUST accept frames of up to 512 (MIN-MAX-FRAME-SIZE) octets.] */
                                    (connection->remote_max_frame_size < 512))
                                {
                                    /* Codes_S_R_S_CONNECTION_01_143: [If any of the values in the received open frame are invalid then the connection shall be closed.] */
                                    /* Codes_S_R_S_CONNECTION_01_220: [The error amqp:invalid-field shall be set in the error.condition field of the CLOSE frame.] */
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing OPEN frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing OPEN frame");
                                }
                                else
                                {
                                    if (connection->connection_state == CONNECTION_STATE_OPEN_SENT)
                                    {
                                        connection_set_state(connection, CONNECTION_STATE_OPENED);
                                    }
                                    else
                                    {
                                        if (send_open_frame(connection) != 0)
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_END);
                                        }
                                        else
                                        {
                                            connection_set_state(connection, CONNECTION_STATE_OPENED);
                                        }
                                    }
                                }

                                open_destroy(open_handle);
                            }
                        }
                        else
                        {
                            /* do nothing for now ... */
                        }
                    }
                    else if (is_close_type_by_descriptor(descriptor))
                    {
                        /* Codes_S_R_S_CONNECTION_01_242: [The connection module shall accept CLOSE frames even if they have extra payload bytes besides the Close performative.] */

                        /* Codes_S_R_S_CONNECTION_01_225: [HDR_RCVD HDR OPEN] */
                        if ((connection->connection_state == CONNECTION_STATE_HDR_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_227: [HDR_EXCH OPEN OPEN] */
                            (connection->connection_state == CONNECTION_STATE_HDR_EXCH) ||
                            /* Codes_S_R_S_CONNECTION_01_228: [OPEN_RCVD OPEN *] */
                            (connection->connection_state == CONNECTION_STATE_OPEN_RCVD) ||
                            /* Codes_S_R_S_CONNECTION_01_235: [CLOSE_SENT - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_CLOSE_SENT) ||
                            /* Codes_S_R_S_CONNECTION_01_236: [DISCARDING - * TCP Close for Write] */
                            (connection->connection_state == CONNECTION_STATE_DISCARDING))
                        {
                            if (xio_close(connection->io, NULL, NULL) != 0)
                            {
                                LogError("xio_close failed");
                            }
                        }
                        else
                        {
                            CLOSE_HANDLE close_handle;

                            /* Codes_S_R_S_CONNECTION_01_012: [A close frame MAY be received on any channel up to the maximum channel number negotiated in open.] */
                            if (channel > connection->channel_max)
                            {
                                close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                            }
                            else
                            {
                                if (amqpvalue_get_close(performative, &close_handle) != 0)
                                {
                                    close_connection_with_error(connection, "amqp:invalid-field", "connection_endpoint_frame_received::failed parsing CLOSE frame", NULL);
                                    LogError("connection_endpoint_frame_received::failed parsing CLOSE frame");
                                }
                                else
                                {
                                    ERROR_HANDLE error;

                                    if (close_get_error(close_handle, &error) != 0)
                                    {
                                        error = NULL;
                                    }

                                    close_destroy(close_handle);

                                    connection_set_state(connection, CONNECTION_STATE_CLOSE_RCVD);

                                    if (send_close_frame(connection, NULL) != 0)
                                    {
                                        LogError("Cannot send CLOSE frame");
                                    }

                                    /* Codes_S_R_S_CONNECTION_01_214: [If the close frame cannot be constructed or sent, the connection shall be closed and set to the END state.] */
                                    if (xio_close(connection->io, NULL, NULL) != 0)
                                    {
                                        LogError("xio_close failed");
                                    }

                                    connection_set_state(connection, CONNECTION_STATE_END);

                                    if (connection->on_connection_close_received_event_subscription.on_connection_close_received != NULL)
                                    {
                                        connection->on_connection_close_received_event_subscription.on_connection_close_received(connection->on_connection_close_received_event_subscription.context, error);
                                    }

                                    error_destroy(error);
                                }
                            }
                        }
                    }
                    else
                    {
                        uint64_t performative_ulong;

                        if (amqpvalue_get_ulong(descriptor, &performative_ulong) != 0)
                        {
                            LogError("Failed getting ulong amqp performative");
                        }
                        else
                        {
                            switch (performative_ulong)
                            {
                            default:
                                LogError("Bad performative: %02x", (unsigned int)performative_ulong);
                                break;

                            case AMQP_BEGIN:
                            {
                                BEGIN_HANDLE begin;

                                if (amqpvalue_get_begin(performative, &begin) != 0)
                                {
                                    LogError("Cannot get begin performative");
                                }
                                else
                                {
                                    uint16_t remote_channel;
                                    ENDPOINT_HANDLE new_endpoint = NULL;
                                    bool remote_begin = false;

                                    if (begin_get_remote_channel(begin, &remote_channel) != 0)
                                    {
                                        remote_begin = true;
                                        if (connection->on_new_endpoint != NULL)
                                        {
                                            new_endpoint = connection_create_endpoint(connection);
                                            if (!connection->on_new_endpoint(connection->on_new_endpoint_callback_context, new_endpoint))
                                            {
                                                connection_destroy_endpoint(new_endpoint);
                                                new_endpoint = NULL;
                                            }
                                        }
                                    }

                                    if (!remote_begin)
                                    {
                                        ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_outgoing_channel(connection, remote_channel);
                                        if (session_endpoint == NULL)
                                        {
                                            LogError("Cannot create session endpoint");
                                        }
                                        else
                                        {
                                            session_endpoint->incoming_channel = channel;
                                            session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }
                                    else
                                    {
                                        if (new_endpoint != NULL)
                                        {
                                            new_endpoint->incoming_channel = channel;
                                            new_endpoint->on_endpoint_frame_received(new_endpoint->callback_context, performative, payload_size, payload_bytes);
                                        }
                                    }

                                    begin_destroy(begin);
                                }

                                break;
                            }

                            case AMQP_FLOW:
                            case AMQP_TRANSFER:
                            case AMQP_DISPOSITION:
                            case AMQP_END:
                            case AMQP_ATTACH:
                            case AMQP_DETACH:
                            {
                                ENDPOINT_INSTANCE* session_endpoint = find_session_endpoint_by_incoming_channel(connection, channel);
                                if (session_endpoint == NULL)
                                {
                                    LogError("Cannot find session endpoint for channel %u", (unsigned int)channel);
                                }
                                else
                                {
                                    session_endpoint->on_endpoint_frame_received(session_endpoint->callback_context, performative, payload_size, payload_bytes);
                                }

                                break;
                            }
                            }
                        }
                    }
                }
                break;

            case CONNECTION_STATE_START:
                /* Codes_S_R_S_CONNECTION_01_224: [START HDR HDR] */
            case CONNECTION_STATE_HDR_SENT:
                /* Codes_S_R_S_CONNECTION_01_226: [HDR_SENT OPEN HDR] */
            case CONNECTION_STATE_OPEN_PIPE:
                /* Codes_S_R_S_CONNECTION_01_230: [OPEN_PIPE ** HDR] */
            case CONNECTION_STATE_OC_PIPE:
                /* Codes_S_R_S_CONNECTION_01_232: [OC_PIPE - HDR TCP Close for Write] */
            case CONNECTION_STATE_CLOSE_RCVD:
                /* Codes_S_R_S_CONNECTION_01_234: [CLOSE_RCVD * - TCP Close for Read] */
            case CONNECTION_STATE_END:
                /* Codes_S_R_S_CONNECTION_01_237: [END - - TCP Close] */
                if (xio_close(connection->io, NULL, NULL) != 0)
                {
                    LogError("xio_close failed");
                }
                break;
            }
        }
    }
}